

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

void __thiscall
libtorrent::dht::node::announce
          (node *this,sha1_hash *info_hash,int listen_port,announce_flags_t flags,
          function<void_(const_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
          *f)

{
  dht_observer *pdVar1;
  _Manager_type p_Var2;
  undefined8 uVar3;
  int iVar4;
  undefined7 in_register_00000009;
  ulong uVar5;
  announce_flags_t flags_00;
  ulong uVar6;
  span<const_char> in;
  _Any_data local_98;
  _Manager_type local_88;
  _Invoker_type local_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  string local_50;
  
  uVar5 = CONCAT71(in_register_00000009,flags.m_val);
  uVar6 = uVar5 & 0xffffffff;
  pdVar1 = this->m_observer;
  if (pdVar1 != (dht_observer *)0x0) {
    iVar4 = (**(pdVar1->super_dht_logger)._vptr_dht_logger)(pdVar1,1);
    if ((char)iVar4 != '\0') {
      pdVar1 = this->m_observer;
      in.m_len = uVar5;
      in.m_ptr = (char *)0x14;
      aux::to_hex_abi_cxx11_(&local_50,(aux *)info_hash,in);
      (*(pdVar1->super_dht_logger)._vptr_dht_logger[1])
                (pdVar1,1,"announcing [ ih: %s p: %d ]",local_50._M_dataplus._M_p,
                 (ulong)(uint)listen_port);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((listen_port == 0) && (pdVar1 = this->m_observer, pdVar1 != (dht_observer *)0x0)) {
    listen_port = (*(pdVar1->super_dht_logger)._vptr_dht_logger[4])
                            (pdVar1,(ulong)((byte)(uVar6 >> 2) & 1),&this->m_sock);
  }
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_88 = (_Manager_type)0x0;
  local_80 = f->_M_invoker;
  p_Var2 = (f->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_98._M_unused._0_8_ = (undefined8)*(undefined8 *)&(f->super__Function_base)._M_functor;
    local_98._8_8_ = *(undefined8 *)((long)&(f->super__Function_base)._M_functor + 8);
    (f->super__Function_base)._M_manager = (_Manager_type)0x0;
    f->_M_invoker = (_Invoker_type)0x0;
    local_88 = p_Var2;
  }
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(0x30);
  *(code **)local_78._M_unused._0_8_ = anon_unknown_0::announce_fun;
  flags_00.m_val = (uchar)uVar6;
  *(uchar *)((long)local_78._M_unused._0_8_ + 8) = flags_00.m_val;
  uVar3 = *(undefined8 *)((info_hash->m_number)._M_elems + 2);
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 0xc) =
       *(undefined8 *)(info_hash->m_number)._M_elems;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x14) = uVar3;
  *(uint *)((long)local_78._M_unused._0_8_ + 0x1c) = (info_hash->m_number)._M_elems[4];
  *(int *)((long)local_78._M_unused._0_8_ + 0x20) = listen_port;
  *(node **)((long)local_78._M_unused._0_8_ + 0x28) = this;
  pcStack_60 = ::std::
               _Function_handler<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_std::_Bind<void_(*(std::_Placeholder<1>,_std::reference_wrapper<libtorrent::dht::node>,_int,_libtorrent::digest32<160L>,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>))(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_libtorrent::dht::node_&,_int,_const_libtorrent::digest32<160L>_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>)>_>
               ::_M_invoke;
  local_68 = ::std::
             _Function_handler<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&),_std::_Bind<void_(*(std::_Placeholder<1>,_std::reference_wrapper<libtorrent::dht::node>,_int,_libtorrent::digest32<160L>,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>))(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_libtorrent::dht::node_&,_int,_const_libtorrent::digest32<160L>_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>)>_>
             ::_M_manager;
  get_peers(this,info_hash,
            (function<void_(const_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
             *)&local_98,
            (function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
             *)&local_78,flags_00);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_88 != (_Manager_type)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  return;
}

Assistant:

void node::announce(sha1_hash const& info_hash, int listen_port, announce_flags_t const flags
	, std::function<void(std::vector<tcp::endpoint> const&)> f)
{
#ifndef TORRENT_DISABLE_LOGGING
	if (m_observer != nullptr && m_observer->should_log(dht_logger::node))
	{
		m_observer->log(dht_logger::node, "announcing [ ih: %s p: %d ]"
			, aux::to_hex(info_hash).c_str(), listen_port);
	}
#endif

	if (listen_port == 0 && m_observer != nullptr)
	{
		listen_port = m_observer->get_listen_port(
			(flags & announce::ssl_torrent) ? aux::transport::ssl : aux::transport::plaintext
			, m_sock);
	}

	get_peers(info_hash, std::move(f)
		, std::bind(&announce_fun, _1, std::ref(*this)
		, listen_port, info_hash, flags), flags);
}